

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void buf2kvid(size_t chunksize,void *buf,fdb_kvs_id_t *id)

{
  ulong *in_RDX;
  ulong *in_RSI;
  ulong in_RDI;
  fdb_kvs_id_t temp;
  size_t size_id;
  ulong local_28;
  undefined8 local_20;
  ulong *local_18;
  
  local_20 = 8;
  local_18 = in_RDX;
  if (in_RDI == 8) {
    local_28 = *in_RSI;
  }
  else if (in_RDI < 8) {
    local_28 = 0;
    memcpy((void *)((long)&local_20 - in_RDI),in_RSI,in_RDI);
  }
  else {
    memcpy(&local_28,(void *)((long)in_RSI + (in_RDI - 8)),8);
  }
  *local_18 = local_28 >> 0x38 | (local_28 & 0xff000000000000) >> 0x28 |
              (local_28 & 0xff0000000000) >> 0x18 | (local_28 & 0xff00000000) >> 8 |
              (local_28 & 0xff000000) << 8 | (local_28 & 0xff0000) << 0x18 |
              (local_28 & 0xff00) << 0x28 | local_28 << 0x38;
  return;
}

Assistant:

void buf2kvid(size_t chunksize, void *buf, fdb_kvs_id_t *id)
{
    size_t size_id = sizeof(fdb_kvs_id_t);
    fdb_kvs_id_t temp;

    if (chunksize == size_id) {
        temp = *((fdb_kvs_id_t*)buf);
    } else if (chunksize < size_id) {
        temp = 0;
        memcpy((uint8_t*)&temp + (size_id - chunksize), buf, chunksize);
    } else { // chunksize > sizeof(fdb_kvs_id_t)
        memcpy(&temp, (uint8_t*)buf + (chunksize - size_id), size_id);
    }
    *id = _endian_decode(temp);
}